

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_math.cxx
# Opt level: O2

void ndiAnglesFromMatrixd(double *outRotationAngles,double *rotationMatrix)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = atan2(rotationMatrix[1],*rotationMatrix);
  dVar2 = cos(dVar1);
  dVar3 = sin(dVar1);
  outRotationAngles[2] = dVar1;
  dVar1 = atan2(-rotationMatrix[2],*rotationMatrix * dVar2 + rotationMatrix[1] * dVar3);
  outRotationAngles[1] = dVar1;
  dVar1 = atan2(rotationMatrix[8] * dVar3 - rotationMatrix[9] * dVar2,
                dVar2 * rotationMatrix[5] - dVar3 * rotationMatrix[4]);
  *outRotationAngles = dVar1;
  return;
}

Assistant:

ndicapiExport void ndiAnglesFromMatrixd(double outRotationAngles[3], const double rotationMatrix[16])
{
  double yaw, cosYaw, sinYaw;

  yaw = atan2(rotationMatrix[1], rotationMatrix[0]);
  cosYaw = cos(yaw);
  sinYaw = sin(yaw);

  outRotationAngles[2] = yaw;
  outRotationAngles[1] = atan2(-rotationMatrix[2], (cosYaw * rotationMatrix[0]) + (sinYaw * rotationMatrix[1]));
  outRotationAngles[0] = atan2((sinYaw * rotationMatrix[8]) - (cosYaw * rotationMatrix[9]), (-sinYaw * rotationMatrix[4]) + (cosYaw * rotationMatrix[5]));
}